

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMImplementationRegistry.cpp
# Opt level: O3

DOMImplementation * xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(XMLCh *features)

{
  BaseRefVectorOf<xercesc_4_0::DOMImplementationSource> *this;
  int iVar1;
  DOMImplementationImpl *pDVar2;
  DOMImplementationSource *pDVar3;
  undefined4 extraout_var;
  XMLSize_t XVar5;
  XMLMutexLock lock;
  XMLMutexLock local_20;
  DOMImplementation *pDVar4;
  
  XMLMutexLock::XMLMutexLock(&local_20,gDOMImplSrcVectorMutex);
  this = gDOMImplSrcVector;
  XVar5 = gDOMImplSrcVector->fCurCount;
  if (XVar5 == 0) {
    pDVar2 = DOMImplementationImpl::getDOMImplementationImpl();
    BaseRefVectorOf<xercesc_4_0::DOMImplementationSource>::ensureExtraCapacity(this,1);
    pDVar3 = &pDVar2->super_DOMImplementationSource;
    if (pDVar2 == (DOMImplementationImpl *)0x0) {
      pDVar3 = (DOMImplementationSource *)0x0;
    }
    XVar5 = this->fCurCount;
    this->fElemList[XVar5] = pDVar3;
    this->fCurCount = XVar5 + 1;
    XVar5 = gDOMImplSrcVector->fCurCount;
  }
  do {
    XVar5 = XVar5 - 1;
    pDVar4 = (DOMImplementation *)0x0;
    if (XVar5 == 0xffffffffffffffff) break;
    pDVar3 = BaseRefVectorOf<xercesc_4_0::DOMImplementationSource>::elementAt
                       (gDOMImplSrcVector,XVar5);
    iVar1 = (*pDVar3->_vptr_DOMImplementationSource[2])(pDVar3,features);
    pDVar4 = (DOMImplementation *)CONCAT44(extraout_var,iVar1);
  } while (pDVar4 == (DOMImplementation *)0x0);
  XMLMutexLock::~XMLMutexLock(&local_20);
  return pDVar4;
}

Assistant:

DOMImplementation *DOMImplementationRegistry::getDOMImplementation(const XMLCh* features) {

    XMLMutexLock lock(gDOMImplSrcVectorMutex);

    XMLSize_t len = gDOMImplSrcVector->size();

    // Put our defined source there
    if (len == 0) {
        gDOMImplSrcVector->addElement((DOMImplementationSource*)DOMImplementationImpl::getDOMImplementationImpl());

        len = gDOMImplSrcVector->size();
    }

    for (XMLSize_t i = len; i > 0; i--) {
        DOMImplementationSource* source = gDOMImplSrcVector->elementAt(i-1);
        DOMImplementation* impl = source->getDOMImplementation(features);
        if (impl)
            return impl;
    }

    return 0;
}